

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_owhere(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  uint uVar2;
  BUFFER *buffer_00;
  char *pcVar3;
  char *pcVar4;
  char *in_RSI;
  long in_RDI;
  int max_found;
  int number;
  bool found;
  OBJ_DATA *in_obj;
  OBJ_DATA *obj;
  BUFFER *buffer;
  char buf [4608];
  undefined4 in_stack_ffffffffffffed88;
  int in_stack_ffffffffffffed8c;
  CHAR_DATA *in_stack_ffffffffffffed90;
  undefined4 in_stack_ffffffffffffed98;
  uint in_stack_ffffffffffffed9c;
  uint uVar5;
  CHAR_DATA *in_stack_ffffffffffffeda0;
  CHAR_DATA *in_stack_ffffffffffffeda8;
  undefined4 in_stack_ffffffffffffedc0;
  int iVar6;
  uint uVar7;
  uint3 in_stack_ffffffffffffedcc;
  uint uVar8;
  OBJ_DATA *local_1230;
  OBJ_DATA *local_1228;
  CHAR_DATA local_1218 [5];
  char *local_10;
  long local_8;
  
  uVar8 = (uint)in_stack_ffffffffffffedcc;
  uVar7 = 0;
  iVar6 = 200;
  local_10 = in_RSI;
  local_8 = in_RDI;
  buffer_00 = new_buf();
  if (*local_10 == '\0') {
    send_to_char((char *)in_stack_ffffffffffffeda0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98));
  }
  else {
    for (local_1228 = object_list; local_1228 != (OBJ_DATA *)0x0; local_1228 = local_1228->next) {
      bVar1 = can_see_obj((CHAR_DATA *)CONCAT44(uVar8,uVar7),
                          (OBJ_DATA *)CONCAT44(iVar6,in_stack_ffffffffffffedc0));
      if (((bVar1) && (bVar1 = is_name((char *)buf._4408_8_,(char *)buf._4400_8_), bVar1)) &&
         (local_1228->level <= *(short *)(local_8 + 0x138))) {
        uVar2 = uVar7 + 1;
        for (local_1230 = local_1228; local_1230->in_obj != (OBJ_DATA *)0x0;
            local_1230 = local_1230->in_obj) {
        }
        uVar5 = in_stack_ffffffffffffed9c;
        if (((local_1230->carried_by == (CHAR_DATA *)0x0) ||
            (bVar1 = can_see(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0),
            uVar5 = in_stack_ffffffffffffed9c, !bVar1)) ||
           (local_1230->carried_by->in_room == (ROOM_INDEX_DATA *)0x0)) {
          in_stack_ffffffffffffed9c = uVar2;
          uVar7 = in_stack_ffffffffffffed9c;
          if ((local_1230->in_room == (ROOM_INDEX_DATA *)0x0) ||
             (bVar1 = can_see_room(in_stack_ffffffffffffeda8,
                                   (ROOM_INDEX_DATA *)in_stack_ffffffffffffeda0),
             uVar7 = in_stack_ffffffffffffed9c, !bVar1)) {
            in_stack_ffffffffffffed9c = uVar5;
            uVar7 = uVar7 - 1;
            goto LAB_00591979;
          }
          in_stack_ffffffffffffed90 = local_1218;
          in_stack_ffffffffffffeda0 = (CHAR_DATA *)local_1228->short_descr;
          pcVar4 = get_room_name((ROOM_INDEX_DATA *)
                                 CONCAT44(in_stack_ffffffffffffed8c,in_stack_ffffffffffffed88));
          sprintf((char *)in_stack_ffffffffffffed90,"%3d) %s is in %s [Room %d]\n\r",
                  (ulong)in_stack_ffffffffffffed9c,in_stack_ffffffffffffeda0,pcVar4,
                  (ulong)(uint)(int)local_1230->in_room->vnum);
        }
        else {
          in_stack_ffffffffffffeda8 = local_1218;
          pcVar4 = local_1228->short_descr;
          uVar7 = uVar2;
          pcVar3 = pers((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98),
                        in_stack_ffffffffffffed90);
          sprintf((char *)in_stack_ffffffffffffeda8,"%3d) %s is carried by %s [Room %d]\n\r",
                  (ulong)uVar2,pcVar4,pcVar3,(ulong)(uint)(int)local_1230->carried_by->in_room->vnum
                 );
        }
        uVar8 = CONCAT13(1,(int3)uVar8);
        if (((char)local_1218[0].next < 'a') || ('z' < (char)local_1218[0].next)) {
          in_stack_ffffffffffffed8c = (int)(char)local_1218[0].next;
        }
        else {
          in_stack_ffffffffffffed8c = (char)local_1218[0].next + -0x20;
        }
        local_1218[0].next._0_1_ = (char)in_stack_ffffffffffffed8c;
        add_buf((BUFFER *)in_stack_ffffffffffffeda8,(char *)in_stack_ffffffffffffeda0);
        if (iVar6 <= (int)uVar7) break;
      }
LAB_00591979:
    }
    if ((uVar8 & 0x1000000) == 0) {
      send_to_char((char *)in_stack_ffffffffffffeda0,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98));
    }
    else {
      buf_string(buffer_00);
      page_to_char((char *)in_stack_ffffffffffffed90,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed8c,in_stack_ffffffffffffed88));
    }
    free_buf((BUFFER *)0x5919cc);
  }
  return;
}

Assistant:

void do_owhere(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_INPUT_LENGTH];
	BUFFER *buffer;
	OBJ_DATA *obj;
	OBJ_DATA *in_obj;
	bool found;
	int number = 0, max_found;

	found = false;
	number = 0;
	max_found = 200;

	buffer = new_buf();

	if (argument[0] == '\0')
	{
		send_to_char("Find what?\n\r", ch);
		return;
	}

	for (obj = object_list; obj != nullptr; obj = obj->next)
	{
		if (!can_see_obj(ch, obj) || !is_name(argument, obj->name) || ch->level < obj->level)
			continue;

		number++;

		for (in_obj = obj; in_obj->in_obj != nullptr; in_obj = in_obj->in_obj)
			;

		if (in_obj->carried_by != nullptr && can_see(ch, in_obj->carried_by) && in_obj->carried_by->in_room != nullptr)
		{
			sprintf(buf, "%3d) %s is carried by %s [Room %d]\n\r",
				number, obj->short_descr,
				pers(in_obj->carried_by, ch),
				in_obj->carried_by->in_room->vnum);
		}
		else if (in_obj->in_room != nullptr && can_see_room(ch, in_obj->in_room))
		{
			sprintf(buf, "%3d) %s is in %s [Room %d]\n\r",
				number,
				obj->short_descr,
				get_room_name(in_obj->in_room),
				in_obj->in_room->vnum);
		}
		else
		{
			number--;
			continue;
		}

		found = true;

		buf[0] = UPPER(buf[0]);
		add_buf(buffer, buf);

		if (number >= max_found)
			break;
	}

	if (!found)
		send_to_char("Nothing like that in heaven or earth.\n\r", ch);
	else
		page_to_char(buf_string(buffer), ch);

	free_buf(buffer);
}